

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_RemoveTarget
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *removetarget;
  PClass *pPVar1;
  PClass *pPVar2;
  PClassActor *filter;
  int flags;
  char *pcVar3;
  undefined8 *puVar4;
  bool bVar5;
  FName local_2c;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar3 = "(paramnum) < numparam";
    goto LAB_003e1aab;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003e1a92:
    pcVar3 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003e1aab:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1846,
                  "int AF_AActor_A_RemoveTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  puVar4 = (undefined8 *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (puVar4 == (undefined8 *)0x0) goto LAB_003e19cd;
    pPVar2 = (PClass *)puVar4[1];
    if (pPVar2 == (PClass *)0x0) {
      pPVar2 = (PClass *)(**(code **)*puVar4)(puVar4);
      puVar4[1] = pPVar2;
    }
    bVar5 = pPVar2 != (PClass *)0x0;
    if (pPVar2 != pPVar1 && bVar5) {
      do {
        pPVar2 = pPVar2->ParentClass;
        bVar5 = pPVar2 != (PClass *)0x0;
        if (pPVar2 == pPVar1) break;
      } while (pPVar2 != (PClass *)0x0);
    }
    if (!bVar5) {
      pcVar3 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003e1aab;
    }
  }
  else {
    if (puVar4 != (undefined8 *)0x0) goto LAB_003e1a92;
LAB_003e19cd:
    puVar4 = (undefined8 *)0x0;
  }
  if (numparam == 1) {
    param = defaultparam->Array;
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar3 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e1af2:
      __assert_fail(pcVar3,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1847,
                    "int AF_AActor_A_RemoveTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    flags = param[1].field_0.i;
LAB_003e1a29:
    if (param[2].field_0.field_3.Type != '\x03') {
LAB_003e1a9b:
      pcVar3 = 
      "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
      ;
LAB_003e1b11:
      __assert_fail(pcVar3,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1848,
                    "int AF_AActor_A_RemoveTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    filter = (PClassActor *)param[2].field_0.field_1.a;
    if (param[2].field_0.field_1.atag != 1) {
      if (filter != (PClassActor *)0x0) goto LAB_003e1a9b;
      filter = (PClassActor *)0x0;
    }
  }
  else {
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar3 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003e1af2;
    }
    flags = param[1].field_0.i;
    if (numparam < 3) {
      param = defaultparam->Array;
      goto LAB_003e1a29;
    }
    if ((param[2].field_0.field_3.Type != '\x03') ||
       (filter = (PClassActor *)param[2].field_0.field_1.a,
       filter != (PClassActor *)0x0 && param[2].field_0.field_1.atag != 1)) {
      pcVar3 = 
      "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
      ;
      goto LAB_003e1b11;
    }
    if (numparam != 3) {
      if (param[3].field_0.field_3.Type != '\0') {
        pcVar3 = "(param[paramnum]).Type == REGT_INT";
        goto LAB_003e1aca;
      }
      goto LAB_003e1a46;
    }
    param = defaultparam->Array;
  }
  if (param[3].field_0.field_3.Type != '\0') {
    pcVar3 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e1aca:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1849,
                  "int AF_AActor_A_RemoveTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_003e1a46:
  removetarget = (AActor *)puVar4[0x41];
  if (removetarget != (AActor *)0x0) {
    if (((removetarget->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      local_2c.Index = param[3].field_0.i;
      DoRemove(removetarget,flags,filter,&local_2c);
    }
    else {
      puVar4[0x41] = 0;
    }
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_RemoveTarget)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT_DEF(flags);
	PARAM_CLASS_DEF(filter, AActor);
	PARAM_NAME_DEF(species);

	if (self->target != NULL)
	{
		DoRemove(self->target, flags, filter, species);
	}
	return 0;
}